

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  void *pvVar1;
  ImDrawData *in_RSI;
  undefined1 *in_RDI;
  ImFontAtlas *this_00;
  ImDrawData *in_stack_fffffffffffffeb0;
  ImPool<ImGuiTabBar> *in_stack_fffffffffffffec0;
  ImGuiInputTextState *in_stack_fffffffffffffed0;
  ImFont *in_stack_fffffffffffffee0;
  ImDrawListSharedData *in_stack_fffffffffffffef0;
  ImDrawListSharedData *in_stack_fffffffffffffef8;
  ImDrawList *in_stack_ffffffffffffff00;
  ImGuiStyle *in_stack_ffffffffffffff10;
  ImGuiIO *in_stack_ffffffffffffff30;
  ImVec2 local_64;
  ImVec2 local_5c;
  undefined8 local_54;
  undefined8 uStack_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  undefined1 local_31;
  void *local_30;
  ImDrawData *local_28;
  ImDrawData *local_10;
  
  local_10 = in_RSI;
  ImGuiIO::ImGuiIO(in_stack_ffffffffffffff30);
  ImGuiStyle::ImGuiStyle(in_stack_ffffffffffffff10);
  ImDrawListSharedData::ImDrawListSharedData(in_stack_fffffffffffffef0);
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x19a0));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x19b0));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x19c0));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x19d0));
  ImGuiStorage::ImGuiStorage((ImGuiStorage *)0x1580b8);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x1a40));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x1a64));
  ImVector<ImGuiColorMod>::ImVector((ImVector<ImGuiColorMod> *)(in_RDI + 0x1a78));
  ImVector<ImGuiStyleMod>::ImVector((ImVector<ImGuiStyleMod> *)(in_RDI + 0x1a88));
  ImVector<ImFont_*>::ImVector((ImVector<ImFont_*> *)(in_RDI + 0x1a98));
  ImVector<ImGuiPopupRef>::ImVector((ImVector<ImGuiPopupRef> *)(in_RDI + 0x1aa8));
  ImVector<ImGuiPopupRef>::ImVector((ImVector<ImGuiPopupRef> *)(in_RDI + 0x1ab8));
  ImGuiNextWindowData::ImGuiNextWindowData((ImGuiNextWindowData *)in_stack_fffffffffffffed0);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffeb0);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffeb0);
  ImGuiNavMoveResult::ImGuiNavMoveResult((ImGuiNavMoveResult *)in_stack_fffffffffffffeb0);
  ImGuiNavMoveResult::ImGuiNavMoveResult((ImGuiNavMoveResult *)in_stack_fffffffffffffeb0);
  ImGuiNavMoveResult::ImGuiNavMoveResult((ImGuiNavMoveResult *)in_stack_fffffffffffffeb0);
  ImDrawData::ImDrawData(in_stack_fffffffffffffeb0);
  ImDrawDataBuilder::ImDrawDataBuilder((ImDrawDataBuilder *)in_stack_fffffffffffffee0);
  ImDrawList::ImDrawList(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ImGuiPayload::ImGuiPayload((ImGuiPayload *)0x15826f);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffeb0);
  ImVector<unsigned_char>::ImVector((ImVector<unsigned_char> *)(in_RDI + 0x1df0));
  ImPool<ImGuiTabBar>::ImPool(in_stack_fffffffffffffec0);
  ImVector<ImGuiTabBar_*>::ImVector((ImVector<ImGuiTabBar_*> *)(in_RDI + 0x1e30));
  ImVector<ImGuiTabBarSortItem>::ImVector((ImVector<ImGuiTabBarSortItem> *)(in_RDI + 0x1e40));
  ImGuiInputTextState::ImGuiInputTextState(in_stack_fffffffffffffed0);
  ImFont::ImFont(in_stack_fffffffffffffee0);
  ImVec4::ImVec4((ImVec4 *)(in_RDI + 0x2d50));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2d6c));
  ImVector<char>::ImVector((ImVector<char> *)(in_RDI + 0x2d78));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2d88));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2d90));
  this_00 = (ImFontAtlas *)(in_RDI + 0x2da0);
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x1583b5);
  ImVector<ImGuiSettingsHandler>::ImVector((ImVector<ImGuiSettingsHandler> *)(in_RDI + 0x2db0));
  ImVector<ImGuiWindowSettings>::ImVector((ImVector<ImGuiWindowSettings> *)(in_RDI + 0x2dc0));
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x158406);
  *in_RDI = 0;
  in_RDI[2] = 0;
  in_RDI[1] = 0;
  *(undefined8 *)(in_RDI + 0x18f0) = 0;
  *(undefined4 *)(in_RDI + 0x18fc) = 0;
  *(undefined4 *)(in_RDI + 0x18f8) = 0;
  in_RDI[3] = -(local_10 == (ImDrawData *)0x0) & 1;
  local_31 = 0;
  if (local_10 == (ImDrawData *)0x0) {
    pvVar1 = ImGui::MemAlloc((size_t)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffeb0 = (ImDrawData *)operator_new(0x78);
    local_31 = 1;
    local_30 = pvVar1;
    local_28 = in_stack_fffffffffffffeb0;
    ImFontAtlas::ImFontAtlas(this_00);
    local_10 = in_stack_fffffffffffffeb0;
  }
  *(ImDrawData **)(in_RDI + 0xa0) = local_10;
  *(undefined8 *)(in_RDI + 0x1988) = 0;
  *(undefined4 *)(in_RDI + 0x1990) = 0;
  *(undefined4 *)(in_RDI + 0x1998) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1994) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x19f0) = 0;
  *(undefined8 *)(in_RDI + 0x19f8) = 0;
  *(undefined8 *)(in_RDI + 0x1a00) = 0;
  *(undefined8 *)(in_RDI + 0x1a08) = 0;
  *(undefined4 *)(in_RDI + 0x1a10) = 0;
  in_RDI[0x1a14] = 0;
  *(undefined4 *)(in_RDI + 0x1a18) = 0;
  *(undefined4 *)(in_RDI + 0x1a20) = 0;
  *(undefined4 *)(in_RDI + 0x1a1c) = 0;
  *(undefined4 *)(in_RDI + 0x1a24) = 0;
  *(undefined4 *)(in_RDI + 0x1a28) = 0;
  *(undefined4 *)(in_RDI + 0x1a2c) = 0;
  *(undefined4 *)(in_RDI + 0x1a30) = 0;
  in_RDI[0x1a34] = 0;
  in_RDI[0x1a35] = 0;
  in_RDI[0x1a36] = 0;
  in_RDI[0x1a37] = 0;
  in_RDI[0x1a38] = 0;
  *(undefined4 *)(in_RDI + 0x1a3c) = 0;
  ImVec2::ImVec2(&local_3c,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 0x1a40) = local_3c;
  *(undefined8 *)(in_RDI + 0x1a50) = 0;
  *(undefined8 *)(in_RDI + 0x1a48) = 0;
  *(undefined4 *)(in_RDI + 0x1a58) = 0;
  *(undefined4 *)(in_RDI + 0x1a5c) = 0;
  *(undefined4 *)(in_RDI + 0x1a60) = 0;
  ImVec2::ImVec2(&local_44,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x1a64) = local_44;
  *(undefined8 *)(in_RDI + 0x1a70) = 0;
  in_RDI[0x1b38] = 0;
  *(undefined4 *)(in_RDI + 0x1b3c) = 0;
  *(undefined8 *)(in_RDI + 0x1b40) = 0;
  *(undefined4 *)(in_RDI + 7000) = 0;
  *(undefined4 *)(in_RDI + 0x1b54) = 0;
  *(undefined4 *)(in_RDI + 0x1b50) = 0;
  *(undefined4 *)(in_RDI + 0x1b4c) = 0;
  *(undefined4 *)(in_RDI + 0x1b48) = 0;
  *(undefined4 *)(in_RDI + 0x1b64) = 0;
  *(undefined4 *)(in_RDI + 0x1b60) = 0;
  *(undefined4 *)(in_RDI + 0x1b5c) = 0;
  *(undefined4 *)(in_RDI + 0x1b68) = 0;
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffeb0);
  *(undefined8 *)(in_RDI + 0x1b6c) = local_54;
  *(undefined8 *)(in_RDI + 0x1b74) = uStack_4c;
  *(undefined4 *)(in_RDI + 0x1b7c) = 0;
  *(undefined8 *)(in_RDI + 0x1b90) = 0;
  *(undefined8 *)(in_RDI + 0x1b88) = 0;
  *(undefined8 *)(in_RDI + 0x1b80) = 0;
  *(undefined4 *)(in_RDI + 0x1b9c) = 0;
  *(undefined4 *)(in_RDI + 0x1b98) = 0;
  in_RDI[0x1ba0] = 0;
  *(undefined4 *)(in_RDI + 0x1ba4) = 0;
  *(undefined4 *)(in_RDI + 0x1ba8) = 0x7fffffff;
  in_RDI[0x1bac] = 0;
  in_RDI[0x1bad] = 0;
  in_RDI[0x1bae] = 1;
  in_RDI[0x1baf] = 0;
  in_RDI[0x1bb0] = 0;
  in_RDI[0x1bb1] = 0;
  in_RDI[0x1bb2] = 0;
  *(undefined4 *)(in_RDI + 0x1bb4) = 0;
  in_RDI[0x1bc8] = 0;
  in_RDI[0x1bc9] = 0;
  *(undefined4 *)(in_RDI + 0x1bcc) = 0;
  *(undefined4 *)(in_RDI + 0x1bd0) = 0;
  *(undefined4 *)(in_RDI + 0x1bdc) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1bd8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1bd4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1cc0) = 0;
  *(undefined1 **)(in_RDI + 0x1d00) = in_RDI + 0x1900;
  *(char **)(in_RDI + 0x1d08) = "##Overlay";
  *(undefined4 *)(in_RDI + 0x1d70) = 0;
  in_RDI[0x1d75] = 0;
  in_RDI[0x1d74] = 0;
  *(undefined4 *)(in_RDI + 0x1d78) = 0;
  *(undefined4 *)(in_RDI + 0x1d7c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1d80) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x1dd8) = 0;
  *(undefined4 *)(in_RDI + 0x1ddc) = 0;
  *(undefined4 *)(in_RDI + 0x1de0) = 0;
  *(undefined4 *)(in_RDI + 0x1de4) = 0;
  *(undefined4 *)(in_RDI + 0x1de8) = 0;
  *(undefined4 *)(in_RDI + 0x1dec) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x1e00) = 0;
  *(undefined4 *)(in_RDI + 0x2d48) = 0;
  *(undefined4 *)(in_RDI + 0x2d4c) = 0x2900000;
  in_RDI[0x2d60] = 0;
  *(undefined4 *)(in_RDI + 0x2d64) = 0;
  *(undefined4 *)(in_RDI + 0x2d68) = 0x3c23d70a;
  ImVec2::ImVec2(&local_5c,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x2d6c) = local_5c;
  *(undefined4 *)(in_RDI + 0x2d74) = 0;
  ImVec2::ImVec2(&local_64,3.4028235e+38,3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0x2d90) = local_64;
  *(undefined8 *)(in_RDI + 0x2d88) = *(undefined8 *)(in_RDI + 0x2d90);
  in_RDI[0x2d98] = 0;
  *(undefined4 *)(in_RDI + 0x2d9c) = 0;
  in_RDI[0x2dd0] = 0;
  *(undefined8 *)(in_RDI + 0x2dd8) = 0;
  *(undefined4 *)(in_RDI + 0x2df0) = 0;
  *(undefined4 *)(in_RDI + 0x2df4) = 2;
  memset(in_RDI + 0x2df8,0,0x1e0);
  *(undefined4 *)(in_RDI + 0x2fd8) = 0;
  *(undefined4 *)(in_RDI + 0x2fdc) = 0;
  *(undefined4 *)(in_RDI + 0x2fe8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x2fe4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x2fe0) = 0xffffffff;
  memset(in_RDI + 0x2fec,0,0xc01);
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas) : OverlayDrawList(NULL)
    {
        Initialized = false;
        FrameScopeActive = FrameScopePushedImplicitWindow = false;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();

        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredRootWindow = NULL;
        HoveredId = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdPreviousFrame = 0;
        HoveredIdTimer = HoveredIdNotActiveTimer = 0.0f;
        ActiveId = 0;
        ActiveIdPreviousFrame = 0;
        ActiveIdIsAlive = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdHasBeenEdited = false;
        ActiveIdPreviousFrameIsAlive = false;
        ActiveIdPreviousFrameHasBeenEdited = false;
        ActiveIdAllowNavDirFlags = 0;
        ActiveIdClickOffset = ImVec2(-1,-1);
        ActiveIdWindow = ActiveIdPreviousFrameWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        LastActiveId = 0;
        LastActiveIdTimer = 0.0f;
        LastValidMousePos = ImVec2(0.0f, 0.0f);
        MovingWindow = NULL;
        NextTreeNodeOpenVal = false;
        NextTreeNodeOpenCond = 0;

        NavWindow = NULL;
        NavId = NavActivateId = NavActivateDownId = NavActivatePressedId = NavInputId = 0;
        NavJustTabbedId = NavJustMovedToId = NavNextActivateId = 0;
        NavInputSource = ImGuiInputSource_None;
        NavScoringRectScreen = ImRect();
        NavScoringCount = 0;
        NavWindowingTarget = NavWindowingTargetAnim = NavWindowingList = NULL;
        NavWindowingTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;
        NavLayer = ImGuiNavLayer_Main;
        NavIdTabCounter = INT_MAX;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;
        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavInitResultId = 0;
        NavMoveFromClampedRefRect = false;
        NavMoveRequest = false;
        NavMoveRequestFlags = 0;
        NavMoveRequestForward = ImGuiNavForward_None;
        NavMoveDir = NavMoveDirLast = NavMoveClipDir = ImGuiDir_None;

        DimBgRatio = 0.0f;
        OverlayDrawList._Data = &DrawListSharedData;
        OverlayDrawList._OwnerName = "##Overlay"; // Give it a name for debugging
        MouseCursor = ImGuiMouseCursor_Arrow;

        DragDropActive = DragDropWithinSourceOrTarget = false;
        DragDropSourceFlags = 0;
        DragDropSourceFrameCount = -1;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptFlags = 0;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        ScalarAsInputTextId = 0;
        ColorEditOptions = ImGuiColorEditFlags__OptionsDefault;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        ScrollbarClickDeltaToGrabCenter = ImVec2(0.0f, 0.0f);
        TooltipOverrideCount = 0;
        PlatformImePos = PlatformImeLastPos = ImVec2(FLT_MAX, FLT_MAX);

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;

        LogEnabled = false;
        LogFile = NULL;
        LogStartDepth = 0;
        LogAutoExpandMaxDepth = 2;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
        memset(TempBuffer, 0, sizeof(TempBuffer));
    }